

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

void __thiscall QMetaObjectBuilder::QMetaObjectBuilder(QMetaObjectBuilder *this)

{
  QMetaObjectBuilderPrivate *pQVar1;
  
  this->_vptr_QMetaObjectBuilder = (_func_int **)&PTR__QMetaObjectBuilder_006a9800;
  pQVar1 = (QMetaObjectBuilderPrivate *)operator_new(0xd8);
  (pQVar1->className).d.d = (Data *)0x0;
  (pQVar1->className).d.ptr = (char *)0x0;
  (pQVar1->className).d.size = 0;
  memset(&pQVar1->methods,0,0xac);
  pQVar1->superClass = &QObject::staticMetaObject;
  pQVar1->staticMetacallFunction = (StaticMetacallFunction)0x0;
  this->d = pQVar1;
  return;
}

Assistant:

QMetaObjectBuilder::QMetaObjectBuilder()
{
    d = new QMetaObjectBuilderPrivate();
}